

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetMetricQueryCreate
          (zet_metric_query_pool_handle_t hMetricQueryPool,uint32_t index,
          zet_metric_query_handle_t *phMetricQuery)

{
  object_t<_zet_metric_query_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  zet_pfnMetricQueryCreate_t pfnCreate;
  dditable_t *dditable;
  zet_metric_query_handle_t *pp_Stack_28;
  ze_result_t result;
  zet_metric_query_handle_t *phMetricQuery_local;
  undefined8 uStack_18;
  uint32_t index_local;
  zet_metric_query_pool_handle_t hMetricQueryPool_local;
  
  dditable._4_4_ = 0;
  pfnCreate = *(zet_pfnMetricQueryCreate_t *)(hMetricQueryPool + 8);
  if (*(code **)(pfnCreate + 0x7d8) == (code *)0x0) {
    hMetricQueryPool_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uStack_18 = *(undefined8 *)hMetricQueryPool;
    pp_Stack_28 = phMetricQuery;
    phMetricQuery_local._4_4_ = index;
    dditable._4_4_ = (**(code **)(pfnCreate + 0x7d8))(uStack_18,index,phMetricQuery);
    hMetricQueryPool_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_zet_metric_query_handle_t*>,_zet_metric_query_handle_t*>
               ::getInstance<_zet_metric_query_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_metric_query_handle_t*>,_zet_metric_query_handle_t*>
                           *)(context + 0x12c0),pp_Stack_28,(dditable_t **)&pfnCreate);
      *pp_Stack_28 = (zet_metric_query_handle_t)poVar1;
      hMetricQueryPool_local._4_4_ = dditable._4_4_;
    }
  }
  return hMetricQueryPool_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricQueryCreate(
        zet_metric_query_pool_handle_t hMetricQueryPool,///< [in] handle of the metric query pool
        uint32_t index,                                 ///< [in] index of the query within the pool
        zet_metric_query_handle_t* phMetricQuery        ///< [out] handle of metric query
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_query_pool_object_t*>( hMetricQueryPool )->dditable;
        auto pfnCreate = dditable->zet.MetricQuery.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricQueryPool = reinterpret_cast<zet_metric_query_pool_object_t*>( hMetricQueryPool )->handle;

        // forward to device-driver
        result = pfnCreate( hMetricQueryPool, index, phMetricQuery );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phMetricQuery = reinterpret_cast<zet_metric_query_handle_t>(
                context->zet_metric_query_factory.getInstance( *phMetricQuery, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }